

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall clipp::parser::try_match_blocked(parser *this,arg_string *arg)

{
  bool bVar1;
  undefined1 local_200 [8];
  parser all;
  undefined1 local_108 [8];
  parser ahead;
  arg_string *arg_local;
  parser *this_local;
  
  ahead._224_8_ = arg;
  bVar1 = detail::scoped_dfs_traverser::operator_cast_to_bool(&this->pos_);
  if (bVar1) {
    parser((parser *)local_108,this);
    all.blocked_ = try_match_blocked(this,(parser *)local_108,(arg_string *)ahead._224_8_);
    if (all.blocked_) {
      this_local._7_1_ = 1;
    }
    all._225_3_ = 0;
    ~parser((parser *)local_108);
    if (all._224_4_ != 0) goto LAB_0011389c;
  }
  if (this->root_ != (group *)0x0) {
    parser((parser *)local_200,this->root_,this->index_ + 1);
    all.blocked_ = try_match_blocked(this,(parser *)local_200,(arg_string *)ahead._224_8_);
    if (all.blocked_) {
      this_local._7_1_ = 1;
    }
    all._225_3_ = 0;
    ~parser((parser *)local_200);
    if (all._224_4_ != 0) goto LAB_0011389c;
  }
  this_local._7_1_ = 0;
LAB_0011389c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool try_match_blocked(const arg_string& arg)
    {
        //try to match ahead (using temporary parser)
        if(pos_) {
            auto ahead = *this;
            if(try_match_blocked(std::move(ahead), arg)) return true;
        }

        //try to match from the beginning (using temporary parser)
        if(root_) {
            parser all{*root_, index_+1};
            if(try_match_blocked(std::move(all), arg)) return true;
        }

        return false;
    }